

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O2

void __thiscall chatra::WaitContext::restoreReferences(WaitContext *this,Reader *r)

{
  pointer puVar1;
  __uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
  _Var2;
  Reference RVar3;
  EventObject *pEVar4;
  size_t i;
  ulong uVar5;
  
  RVar3 = Reader::readReference(r);
  (this->self).node = RVar3.node;
  for (uVar5 = 0;
      puVar1 = (this->targets).
               super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->targets).
                            super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar5 = uVar5 + 1) {
    *(WaitContext **)
     puVar1[uVar5]._M_t.
     super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
     ._M_t = this;
    pEVar4 = derefAsEventObject((this->super_Object).refsArray.
                                super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar5].node);
    *(EventObject **)
     ((long)puVar1[uVar5]._M_t.
            super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
            ._M_t + 0x30) = pEVar4;
    _Var2._M_t.
    super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
    .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl =
         puVar1[uVar5]._M_t.
         super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
         ._M_t;
    EventObject::registerWatcher
              (*(EventObject **)
                ((long)_Var2._M_t.
                       super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
                       .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl +
                0x30),(void *)_Var2._M_t.
                              super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
                              .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>.
                              _M_head_impl,WaitContextEventWatcher);
    _Var2._M_t.
    super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
    .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl =
         puVar1[uVar5]._M_t.
         super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
         ._M_t;
    EventObject::activateWatcher
              (*(EventObject **)
                ((long)_Var2._M_t.
                       super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
                       .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl +
                0x30),(void *)_Var2._M_t.
                              super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
                              .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>.
                              _M_head_impl);
  }
  return;
}

Assistant:

void WaitContext::restoreReferences(Reader& r) {
	self = r.readReference();

	for (size_t i = 0; i < targets.size(); i++) {
		auto& t = targets[i];
		t->ct = this;
		t->eventObject = derefAsEventObject(ref(i));
		t->eventObject->registerWatcher(t.get(), WaitContextEventWatcher);
		t->eventObject->activateWatcher(t.get());
	}
}